

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InstanceNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceNameSyntax,slang::syntax::InstanceNameSyntax_const&>
          (BumpAllocator *this,InstanceNameSyntax *args)

{
  InstanceNameSyntax *pIVar1;
  InstanceNameSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pIVar1 = (InstanceNameSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::InstanceNameSyntax::InstanceNameSyntax(in_RSI,pIVar1);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }